

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O2

int ConvertStringToInt32(TCHAR *szString,size_t nMaxDigits,PDWORD PtrValue)

{
  byte bVar1;
  size_t i;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  
  if ((nMaxDigits & 1) != 0) {
    __assert_fail("(nMaxDigits & 0x01) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/Common.cpp"
                  ,0x1ef,"int ConvertStringToInt32(const TCHAR *, size_t, PDWORD)");
  }
  if (nMaxDigits < 9) {
    *PtrValue = 0;
    uVar4 = 0;
    uVar2 = 0;
    while( true ) {
      if (nMaxDigits >> 1 == uVar2) {
        return 0;
      }
      bVar3 = AsciiToUpperTable_BkSlash[szString[uVar2 * 2]] - 0x30;
      if (9 < bVar3) {
        bVar3 = AsciiToUpperTable_BkSlash[szString[uVar2 * 2]] - 0x37;
      }
      bVar1 = AsciiToUpperTable_BkSlash[szString[uVar2 * 2 + 1]] - 0x30;
      if (9 < bVar1) {
        bVar1 = AsciiToUpperTable_BkSlash[szString[uVar2 * 2 + 1]] - 0x37;
      }
      if (0xf < (bVar1 | bVar3)) break;
      uVar4 = (uint)(byte)(bVar3 << 4) | uVar4 << 8 | (uint)bVar1;
      *PtrValue = uVar4;
      uVar2 = uVar2 + 1;
    }
    return 1000;
  }
  __assert_fail("nMaxDigits <= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/Common.cpp"
                ,0x1f0,"int ConvertStringToInt32(const TCHAR *, size_t, PDWORD)");
}

Assistant:

int ConvertStringToInt32(const TCHAR * szString, size_t nMaxDigits, PDWORD PtrValue)
{
    // The number of digits must be even
    assert((nMaxDigits & 0x01) == 0);
    assert(nMaxDigits <= 8);

    // Prepare the variables
    PtrValue[0] = 0;
    nMaxDigits >>= 1;

    // Convert the string up to the number of digits
    for(size_t i = 0; i < nMaxDigits; i++)
    {
        BYTE DigitOne;
        BYTE DigitTwo;

        DigitOne = (BYTE)(AsciiToUpperTable_BkSlash[szString[0]] - _T('0'));
        if(DigitOne > 9)
            DigitOne -= 'A' - '9' - 1;

        DigitTwo = (BYTE)(AsciiToUpperTable_BkSlash[szString[1]] - _T('0'));
        if(DigitTwo > 9)
            DigitTwo -= 'A' - '9' - 1;

        if(DigitOne > 0x0F || DigitTwo > 0x0F)
            return ERROR_BAD_FORMAT;

        PtrValue[0] = (PtrValue[0] << 0x08) | (DigitOne << 0x04) | DigitTwo;
        szString += 2;
    }

    return ERROR_SUCCESS;
}